

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O3

int idaLsFree(IDAMem IDA_mem)

{
  void *pvVar1;
  
  if ((IDA_mem != (IDAMem)0x0) && (pvVar1 = IDA_mem->ida_lmem, pvVar1 != (void *)0x0)) {
    if (*(long *)((long)pvVar1 + 0x30) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    }
    if (*(long *)((long)pvVar1 + 0x38) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x38) = 0;
    }
    if (*(long *)((long)pvVar1 + 0x40) != 0) {
      N_VDestroy();
      *(undefined8 *)((long)pvVar1 + 0x40) = 0;
    }
    *(undefined8 *)((long)pvVar1 + 0x28) = 0;
    *(undefined8 *)((long)pvVar1 + 0x48) = 0;
    *(undefined8 *)((long)pvVar1 + 0x50) = 0;
    *(undefined8 *)((long)pvVar1 + 0x58) = 0;
    if (*(code **)((long)pvVar1 + 0x110) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x110))(IDA_mem);
    }
    free(IDA_mem->ida_lmem);
  }
  return 0;
}

Assistant:

int idaLsFree(IDAMem IDA_mem)
{
  IDALsMem idals_mem;

  /* Return immediately if IDA_mem or IDA_mem->ida_lmem are NULL */
  if (IDA_mem == NULL) { return (IDALS_SUCCESS); }
  if (IDA_mem->ida_lmem == NULL) { return (IDALS_SUCCESS); }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* Free N_Vector memory */
  if (idals_mem->ytemp)
  {
    N_VDestroy(idals_mem->ytemp);
    idals_mem->ytemp = NULL;
  }
  if (idals_mem->yptemp)
  {
    N_VDestroy(idals_mem->yptemp);
    idals_mem->yptemp = NULL;
  }
  if (idals_mem->x)
  {
    N_VDestroy(idals_mem->x);
    idals_mem->x = NULL;
  }

  /* Nullify other N_Vector pointers */
  idals_mem->ycur  = NULL;
  idals_mem->ypcur = NULL;
  idals_mem->rcur  = NULL;

  /* Nullify SUNMatrix pointer */
  idals_mem->J = NULL;

  /* Free preconditioner memory (if applicable) */
  if (idals_mem->pfree) { idals_mem->pfree(IDA_mem); }

  /* free IDALs interface structure */
  free(IDA_mem->ida_lmem);

  return (IDALS_SUCCESS);
}